

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_read_mcc(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  uint uVar1;
  opj_simple_mcc_decorrelation_data_t *poVar2;
  void *pvVar3;
  uint uVar4;
  OPJ_UINT32 OVar5;
  char *pcVar6;
  opj_mct_data_t *poVar7;
  OPJ_BOOL OVar8;
  uint uVar9;
  uint uVar10;
  opj_tcp_t *poVar11;
  long lVar12;
  OPJ_BYTE *pOVar13;
  opj_simple_mcc_decorrelation_data_t *poVar14;
  OPJ_UINT32 l_tmp;
  OPJ_UINT32 l_nb_comps;
  OPJ_UINT32 l_indix;
  OPJ_UINT32 l_nb_collections;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  undefined4 local_40;
  uint local_3c;
  opj_mct_data_t **local_38;
  
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x16db,
                  "OPJ_BOOL opj_j2k_read_mcc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x16dc,
                  "OPJ_BOOL opj_j2k_read_mcc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x16dd,
                  "OPJ_BOOL opj_j2k_read_mcc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    poVar11 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    poVar11 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  if (p_header_size < 2) {
LAB_001179b7:
    pcVar6 = "Error reading MCC marker\n";
LAB_001179be:
    OVar8 = 0;
    opj_event_msg(p_manager,1,pcVar6);
  }
  else {
    opj_read_bytes_LE(p_header_data,&local_54,2);
    if (local_54 == 0) {
      if (p_header_size < 7) goto LAB_001179b7;
      opj_read_bytes_LE(p_header_data + 2,&local_4c,1);
      poVar2 = poVar11->m_mcc_records;
      uVar10 = poVar11->m_nb_mcc_records;
      pvVar3 = (void *)0x0;
      poVar14 = poVar2;
      if (uVar10 != 0) {
        do {
          if (poVar14->m_index == local_4c) goto LAB_00117a61;
          uVar1 = (int)pvVar3 + 1;
          pvVar3 = (void *)(ulong)uVar1;
          poVar14 = poVar14 + 1;
        } while (uVar10 != uVar1);
LAB_00117a65:
        if (uVar10 != poVar11->m_nb_max_mcc_records) {
LAB_00117ac8:
          poVar14 = poVar2 + uVar10;
          local_40 = (undefined4)CONCAT71((int7)((ulong)pvVar3 >> 8),1);
          goto LAB_00117ae2;
        }
        poVar11->m_nb_max_mcc_records = uVar10 + 10;
        poVar2 = (opj_simple_mcc_decorrelation_data_t *)
                 opj_realloc(poVar2,(ulong)(uVar10 + 10) << 5);
        if (poVar2 != (opj_simple_mcc_decorrelation_data_t *)0x0) {
          poVar11->m_mcc_records = poVar2;
          pvVar3 = memset(poVar2 + poVar11->m_nb_mcc_records,0,
                          (ulong)(poVar11->m_nb_max_mcc_records - poVar11->m_nb_mcc_records) << 5);
          poVar2 = poVar11->m_mcc_records;
          uVar10 = poVar11->m_nb_mcc_records;
          goto LAB_00117ac8;
        }
        opj_free(poVar11->m_mcc_records);
        poVar11->m_mcc_records = (opj_simple_mcc_decorrelation_data_t *)0x0;
        poVar11->m_nb_mcc_records = 0;
        poVar11->m_nb_max_mcc_records = 0;
        pcVar6 = "Not enough memory to read MCC marker\n";
        goto LAB_001179be;
      }
LAB_00117a61:
      if ((uint)pvVar3 == uVar10) goto LAB_00117a65;
      local_40 = 0;
LAB_00117ae2:
      poVar14->m_index = local_4c;
      opj_read_bytes_LE(p_header_data + 3,&local_54,2);
      if (local_54 != 0) goto LAB_001179ec;
      opj_read_bytes_LE(p_header_data + 5,&local_3c,2);
      if (local_3c < 2) {
        uVar10 = p_header_size - 7;
        if (local_3c != 0) {
          pOVar13 = p_header_data + 7;
          local_38 = &poVar14->m_decorrelation_array;
          uVar1 = 0;
          do {
            if (uVar10 < 3) goto LAB_001179b7;
            local_44 = uVar1;
            opj_read_bytes_LE(pOVar13,&local_54,1);
            if (local_54 != 1) {
              pcVar6 = "Cannot take in charge collections other than array decorrelation\n";
              goto LAB_001179f3;
            }
            opj_read_bytes_LE(pOVar13 + 1,&local_50,2);
            lVar12 = (ulong)(local_50 >> 0xf) + 1;
            uVar1 = local_50 & 0x7fff;
            poVar14->m_nb_comps = uVar1;
            OVar5 = (OPJ_UINT32)lVar12;
            uVar4 = OVar5 * uVar1 + 2;
            uVar9 = (uVar10 - 3) - uVar4;
            if (uVar10 - 3 < uVar4) goto LAB_001179b7;
            pOVar13 = pOVar13 + 3;
            local_48 = uVar9;
            if (uVar1 != 0) {
              uVar10 = 0;
              do {
                opj_read_bytes_LE(pOVar13,&local_54,OVar5);
                if (uVar10 != local_54) goto LAB_00117d7c;
                pOVar13 = pOVar13 + lVar12;
                uVar10 = uVar10 + 1;
              } while (uVar10 < poVar14->m_nb_comps);
            }
            opj_read_bytes_LE(pOVar13,&local_50,2);
            uVar10 = local_50 & 0x7fff;
            if (uVar10 != poVar14->m_nb_comps) {
              pcVar6 = "Cannot take in charge collections without same number of indixes\n";
              local_50 = uVar10;
              goto LAB_001179f3;
            }
            lVar12 = (ulong)(local_50 >> 0xf) + 1;
            OVar5 = (OPJ_UINT32)lVar12;
            uVar1 = OVar5 * uVar10 + 3;
            uVar4 = local_48 - uVar1;
            local_50 = uVar10;
            if (local_48 < uVar1) goto LAB_001179b7;
            pOVar13 = pOVar13 + 2;
            local_48 = uVar4;
            if (uVar10 != 0) {
              uVar1 = 0;
              do {
                opj_read_bytes_LE(pOVar13,&local_54,OVar5);
                if (uVar1 != local_54) goto LAB_00117d7c;
                pOVar13 = pOVar13 + lVar12;
                uVar1 = uVar1 + 1;
              } while (uVar1 < poVar14->m_nb_comps);
            }
            opj_read_bytes_LE(pOVar13,&local_54,3);
            poVar14->field_0x18 = poVar14->field_0x18 & 0xfe | (local_54 >> 0x10 & 1) == 0;
            *local_38 = (opj_mct_data_t *)0x0;
            local_38[1] = (opj_mct_data_t *)0x0;
            local_4c = local_54 & 0xff;
            if (local_4c != 0) {
              OVar5 = poVar11->m_nb_mct_records;
              if (OVar5 == 0) goto LAB_001179b7;
              poVar7 = poVar11->m_mct_records;
              while (poVar7->m_index != local_4c) {
                poVar7 = poVar7 + 1;
                OVar5 = OVar5 - 1;
                if (OVar5 == 0) goto LAB_001179b7;
              }
              *local_38 = poVar7;
            }
            local_4c = local_54 >> 8 & 0xff;
            if (local_4c != 0) {
              OVar5 = poVar11->m_nb_mct_records;
              if (OVar5 == 0) goto LAB_001179b7;
              poVar7 = poVar11->m_mct_records;
              while (poVar7->m_index != local_4c) {
                poVar7 = poVar7 + 1;
                OVar5 = OVar5 - 1;
                if (OVar5 == 0) goto LAB_001179b7;
              }
              poVar14->m_offset_array = poVar7;
            }
            pOVar13 = pOVar13 + 3;
            uVar1 = local_44 + 1;
            uVar10 = local_48;
          } while (uVar1 < local_3c);
        }
        if (uVar10 == 0) {
          if ((char)local_40 == '\0') {
            return 1;
          }
          poVar11->m_nb_mcc_records = poVar11->m_nb_mcc_records + 1;
          return 1;
        }
        goto LAB_001179b7;
      }
      pcVar6 = "Cannot take in charge multiple collections\n";
    }
    else {
LAB_001179ec:
      pcVar6 = "Cannot take in charge multiple data spanning\n";
    }
LAB_001179f3:
    opj_event_msg(p_manager,2,pcVar6);
    OVar8 = 1;
  }
  return OVar8;
LAB_00117d7c:
  pcVar6 = "Cannot take in charge collections with indix shuffle\n";
  goto LAB_001179f3;
}

Assistant:

static OPJ_BOOL opj_j2k_read_mcc(opj_j2k_t *p_j2k,
                                 OPJ_BYTE * p_header_data,
                                 OPJ_UINT32 p_header_size,
                                 opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 i, j;
    OPJ_UINT32 l_tmp;
    OPJ_UINT32 l_indix;
    opj_tcp_t * l_tcp;
    opj_simple_mcc_decorrelation_data_t * l_mcc_record;
    opj_mct_data_t * l_mct_data;
    OPJ_UINT32 l_nb_collections;
    OPJ_UINT32 l_nb_comps;
    OPJ_UINT32 l_nb_bytes_by_comp;
    OPJ_BOOL l_new_mcc = OPJ_FALSE;

    /* preconditions */
    assert(p_header_data != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    l_tcp = p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ?
            &p_j2k->m_cp.tcps[p_j2k->m_current_tile_number] :
            p_j2k->m_specific_param.m_decoder.m_default_tcp;

    if (p_header_size < 2) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
        return OPJ_FALSE;
    }

    /* first marker */
    opj_read_bytes(p_header_data, &l_tmp, 2);                       /* Zmcc */
    p_header_data += 2;
    if (l_tmp != 0) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Cannot take in charge multiple data spanning\n");
        return OPJ_TRUE;
    }

    if (p_header_size < 7) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
        return OPJ_FALSE;
    }

    opj_read_bytes(p_header_data, &l_indix,
                   1); /* Imcc -> no need for other values, take the first */
    ++p_header_data;

    l_mcc_record = l_tcp->m_mcc_records;

    for (i = 0; i < l_tcp->m_nb_mcc_records; ++i) {
        if (l_mcc_record->m_index == l_indix) {
            break;
        }
        ++l_mcc_record;
    }

    /** NOT FOUND */
    if (i == l_tcp->m_nb_mcc_records) {
        if (l_tcp->m_nb_mcc_records == l_tcp->m_nb_max_mcc_records) {
            opj_simple_mcc_decorrelation_data_t *new_mcc_records;
            l_tcp->m_nb_max_mcc_records += OPJ_J2K_MCC_DEFAULT_NB_RECORDS;

            new_mcc_records = (opj_simple_mcc_decorrelation_data_t *) opj_realloc(
                                  l_tcp->m_mcc_records, l_tcp->m_nb_max_mcc_records * sizeof(
                                      opj_simple_mcc_decorrelation_data_t));
            if (! new_mcc_records) {
                opj_free(l_tcp->m_mcc_records);
                l_tcp->m_mcc_records = NULL;
                l_tcp->m_nb_max_mcc_records = 0;
                l_tcp->m_nb_mcc_records = 0;
                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read MCC marker\n");
                return OPJ_FALSE;
            }
            l_tcp->m_mcc_records = new_mcc_records;
            l_mcc_record = l_tcp->m_mcc_records + l_tcp->m_nb_mcc_records;
            memset(l_mcc_record, 0, (l_tcp->m_nb_max_mcc_records - l_tcp->m_nb_mcc_records)
                   * sizeof(opj_simple_mcc_decorrelation_data_t));
        }
        l_mcc_record = l_tcp->m_mcc_records + l_tcp->m_nb_mcc_records;
        l_new_mcc = OPJ_TRUE;
    }
    l_mcc_record->m_index = l_indix;

    /* only one marker atm */
    opj_read_bytes(p_header_data, &l_tmp, 2);                       /* Ymcc */
    p_header_data += 2;
    if (l_tmp != 0) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Cannot take in charge multiple data spanning\n");
        return OPJ_TRUE;
    }

    opj_read_bytes(p_header_data, &l_nb_collections,
                   2);                              /* Qmcc -> number of collections -> 1 */
    p_header_data += 2;

    if (l_nb_collections > 1) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Cannot take in charge multiple collections\n");
        return OPJ_TRUE;
    }

    p_header_size -= 7;

    for (i = 0; i < l_nb_collections; ++i) {
        if (p_header_size < 3) {
            opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
            return OPJ_FALSE;
        }

        opj_read_bytes(p_header_data, &l_tmp,
                       1); /* Xmcci type of component transformation -> array based decorrelation */
        ++p_header_data;

        if (l_tmp != 1) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Cannot take in charge collections other than array decorrelation\n");
            return OPJ_TRUE;
        }

        opj_read_bytes(p_header_data, &l_nb_comps, 2);

        p_header_data += 2;
        p_header_size -= 3;

        l_nb_bytes_by_comp = 1 + (l_nb_comps >> 15);
        l_mcc_record->m_nb_comps = l_nb_comps & 0x7fff;

        if (p_header_size < (l_nb_bytes_by_comp * l_mcc_record->m_nb_comps + 2)) {
            opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
            return OPJ_FALSE;
        }

        p_header_size -= (l_nb_bytes_by_comp * l_mcc_record->m_nb_comps + 2);

        for (j = 0; j < l_mcc_record->m_nb_comps; ++j) {
            opj_read_bytes(p_header_data, &l_tmp,
                           l_nb_bytes_by_comp);      /* Cmccij Component offset*/
            p_header_data += l_nb_bytes_by_comp;

            if (l_tmp != j) {
                opj_event_msg(p_manager, EVT_WARNING,
                              "Cannot take in charge collections with indix shuffle\n");
                return OPJ_TRUE;
            }
        }

        opj_read_bytes(p_header_data, &l_nb_comps, 2);
        p_header_data += 2;

        l_nb_bytes_by_comp = 1 + (l_nb_comps >> 15);
        l_nb_comps &= 0x7fff;

        if (l_nb_comps != l_mcc_record->m_nb_comps) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Cannot take in charge collections without same number of indixes\n");
            return OPJ_TRUE;
        }

        if (p_header_size < (l_nb_bytes_by_comp * l_mcc_record->m_nb_comps + 3)) {
            opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
            return OPJ_FALSE;
        }

        p_header_size -= (l_nb_bytes_by_comp * l_mcc_record->m_nb_comps + 3);

        for (j = 0; j < l_mcc_record->m_nb_comps; ++j) {
            opj_read_bytes(p_header_data, &l_tmp,
                           l_nb_bytes_by_comp);      /* Wmccij Component offset*/
            p_header_data += l_nb_bytes_by_comp;

            if (l_tmp != j) {
                opj_event_msg(p_manager, EVT_WARNING,
                              "Cannot take in charge collections with indix shuffle\n");
                return OPJ_TRUE;
            }
        }

        opj_read_bytes(p_header_data, &l_tmp, 3); /* Wmccij Component offset*/
        p_header_data += 3;

        l_mcc_record->m_is_irreversible = !((l_tmp >> 16) & 1);
        l_mcc_record->m_decorrelation_array = 00;
        l_mcc_record->m_offset_array = 00;

        l_indix = l_tmp & 0xff;
        if (l_indix != 0) {
            l_mct_data = l_tcp->m_mct_records;
            for (j = 0; j < l_tcp->m_nb_mct_records; ++j) {
                if (l_mct_data->m_index == l_indix) {
                    l_mcc_record->m_decorrelation_array = l_mct_data;
                    break;
                }
                ++l_mct_data;
            }

            if (l_mcc_record->m_decorrelation_array == 00) {
                opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
                return OPJ_FALSE;
            }
        }

        l_indix = (l_tmp >> 8) & 0xff;
        if (l_indix != 0) {
            l_mct_data = l_tcp->m_mct_records;
            for (j = 0; j < l_tcp->m_nb_mct_records; ++j) {
                if (l_mct_data->m_index == l_indix) {
                    l_mcc_record->m_offset_array = l_mct_data;
                    break;
                }
                ++l_mct_data;
            }

            if (l_mcc_record->m_offset_array == 00) {
                opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
                return OPJ_FALSE;
            }
        }
    }

    if (p_header_size != 0) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
        return OPJ_FALSE;
    }

    if (l_new_mcc) {
        ++l_tcp->m_nb_mcc_records;
    }

    return OPJ_TRUE;
}